

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalysis.cpp
# Opt level: O0

void __thiscall
TPZAnalysis::ShowShape(TPZAnalysis *this,string *plotfile,TPZVec<long> *equationindices)

{
  int iVar1;
  TPZStack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>
  *this_00;
  pointer ppVar2;
  TPZAnalysis *in_RDI;
  int nstate;
  TPZMaterial *mat;
  TPZStack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>
  vecnames;
  TPZStack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>
  scalnames;
  map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
  *in_stack_fffffffffffffc88;
  _Rb_tree_iterator<std::pair<const_int,_TPZMaterial_*>_> *in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc98;
  TPZStack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>
  *in_stack_fffffffffffffca0;
  allocator<char> local_349;
  string local_348 [8];
  allocator<char> *in_stack_fffffffffffffcc0;
  char *in_stack_fffffffffffffcc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcd0;
  allocator<char> local_321;
  string local_320 [36];
  int local_2fc;
  _Base_ptr local_2f8;
  TPZMaterial *local_2f0;
  TPZVec<long> *in_stack_fffffffffffffd70;
  string *in_stack_fffffffffffffd78;
  TPZStack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>
  *in_stack_fffffffffffffd80;
  TPZStack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>
  *in_stack_fffffffffffffd88;
  TPZAnalysis *in_stack_fffffffffffffd90;
  
  SetStep(in_RDI,1);
  TPZStack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>::
  TPZStack(in_stack_fffffffffffffca0);
  TPZStack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>::
  TPZStack(in_stack_fffffffffffffca0);
  this_00 = (TPZStack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>
             *)TPZCompMesh::MaterialVec(in_RDI->fCompMesh);
  local_2f8 = (_Base_ptr)
              std::
              map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
              ::begin(in_stack_fffffffffffffc88);
  ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_TPZMaterial_*>_>::operator->
                     (in_stack_fffffffffffffc90);
  local_2f0 = ppVar2->second;
  iVar1 = (**(code **)(*(long *)local_2f0 + 0x78))();
  local_2fc = iVar1;
  if (iVar1 == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
    TPZStack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>::
    Push(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar1,in_stack_fffffffffffffc98));
    std::__cxx11::string::~string(local_320);
    std::allocator<char>::~allocator(&local_321);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
    TPZStack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>::
    Push(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar1,in_stack_fffffffffffffc98));
    std::__cxx11::string::~string(local_348);
    std::allocator<char>::~allocator(&local_349);
  }
  ShowShapeInternal<double>
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
             in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  TPZStack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>::
  ~TPZStack((TPZStack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>
             *)0x1c34c4d);
  TPZStack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>::
  ~TPZStack((TPZStack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>
             *)0x1c34c5a);
  return;
}

Assistant:

void TPZAnalysis::ShowShape(const std::string &plotfile, TPZVec<int64_t> &equationindices)
{
	
    SetStep(1);
    TPZStack<std::string> scalnames,vecnames;
    TPZMaterial *mat = fCompMesh->MaterialVec().begin()->second;
    int nstate = mat->NStateVariables();
    if (nstate == 1) {
        scalnames.Push("Solution");
    }
    else
    {
        vecnames.Push("Solution");
    }
    //TODOCOMPLEX
    ShowShapeInternal<STATE>(scalnames,vecnames,plotfile,equationindices);
}